

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMarkers::ChLinkMarkers(ChLinkMarkers *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [64];
  
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_00b3e0c8;
  this->marker1 = (ChMarker *)0x0;
  this->marker2 = (ChMarker *)0x0;
  this->markID1 = 0;
  this->markID2 = 0;
  (this->relM).pos.m_data[0] = CSYSNORM;
  (this->relM).pos.m_data[1] = DAT_00b90b60;
  (this->relM).pos.m_data[2] = DAT_00b90b68;
  (this->relM).rot.m_data[0] = DAT_00b90b70;
  (this->relM).rot.m_data[1] = DAT_00b90b78;
  (this->relM).rot.m_data[2] = DAT_00b90b80;
  (this->relM).rot.m_data[3] = DAT_00b90b88;
  dVar1 = CSYSNULL;
  (this->relM_dt).pos.m_data[0] = CSYSNULL;
  dVar2 = DAT_00b90b28;
  (this->relM_dt).pos.m_data[1] = DAT_00b90b28;
  dVar3 = DAT_00b90b30;
  (this->relM_dt).pos.m_data[2] = DAT_00b90b30;
  dVar4 = DAT_00b90b38;
  (this->relM_dt).rot.m_data[0] = DAT_00b90b38;
  dVar5 = DAT_00b90b40;
  (this->relM_dt).rot.m_data[1] = DAT_00b90b40;
  dVar6 = DAT_00b90b48;
  (this->relM_dt).rot.m_data[2] = DAT_00b90b48;
  dVar7 = DAT_00b90b50;
  (this->relM_dt).rot.m_data[3] = DAT_00b90b50;
  (this->relM_dtdt).pos.m_data[0] = dVar1;
  (this->relM_dtdt).pos.m_data[1] = dVar2;
  (this->relM_dtdt).pos.m_data[2] = dVar3;
  (this->relM_dtdt).rot.m_data[0] = dVar4;
  (this->relM_dtdt).rot.m_data[1] = dVar5;
  (this->relM_dtdt).rot.m_data[2] = dVar6;
  (this->relM_dtdt).rot.m_data[3] = dVar7;
  this->relAngle = (double)SUB328(ZEXT832(0) << 0x20,0);
  dVar1 = VNULL;
  this->relAxis = (ChVector<double>)SUB3224(ZEXT832(0) << 0x20,8);
  (this->relRotaxis).m_data[0] = VNULL;
  dVar2 = DAT_00b90ac0;
  (this->relRotaxis).m_data[1] = DAT_00b90ac0;
  dVar3 = DAT_00b90ac8;
  (this->relRotaxis).m_data[2] = DAT_00b90ac8;
  (this->relWvel).m_data[0] = dVar1;
  (this->relWvel).m_data[1] = dVar2;
  (this->relWvel).m_data[2] = dVar3;
  (this->relWacc).m_data[0] = dVar1;
  (this->relWacc).m_data[1] = dVar2;
  (this->relWacc).m_data[2] = dVar3;
  (this->C_force).m_data[0] = dVar1;
  (this->C_force).m_data[1] = dVar2;
  (this->C_force).m_data[2] = dVar3;
  (this->C_torque).m_data[0] = dVar1;
  (this->C_torque).m_data[1] = dVar2;
  (this->C_torque).m_data[2] = dVar3;
  auVar8 = ZEXT864(0) << 0x20;
  this->PQw = (ChVector<double>)auVar8._0_24_;
  this->PQw_dt = (ChVector<double>)auVar8._24_24_;
  (this->PQw_dtdt).m_data[0] = (double)auVar8._48_8_;
  (this->PQw_dtdt).m_data[1] = (double)auVar8._56_8_;
  *(undefined1 (*) [64])((this->PQw_dtdt).m_data + 2) = auVar8;
  *(undefined1 (*) [64])((this->q_BC).m_data + 3) = auVar8;
  return;
}

Assistant:

ChLinkMarkers::ChLinkMarkers()
    : marker1(NULL),
      marker2(NULL),
      markID1(0),
      markID2(0),
      relM(CSYSNORM),
      relM_dt(CSYSNULL),
      relM_dtdt(CSYSNULL),
      relAngle(0),
      relRotaxis(VNULL),
      relWvel(VNULL),
      relWacc(VNULL),
      C_force(VNULL),
      C_torque(VNULL) {}